

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O3

void duckdb::TimeTZAverageOperation::
     Finalize<duckdb::dtime_tz_t,duckdb::AvgState<duckdb::hugeint_t>>
               (AvgState<duckdb::hugeint_t> *state,dtime_tz_t *target,
               AggregateFinalizeData *finalize_data)

{
  ulong *result_00;
  uint64_t *in_R8;
  hugeint_t hVar1;
  hugeint_t input;
  uint64_t remainder;
  long result;
  ulong local_30;
  long local_28;
  
  if (state->count != 0) {
    result_00 = &local_30;
    hVar1.upper = state->count;
    hVar1.lower = (state->value).upper;
    hVar1 = Hugeint::DivModPositive((Hugeint *)(state->value).lower,hVar1,(uint64_t)result_00,in_R8)
    ;
    local_28 = 0;
    input.upper = (int64_t)&local_28;
    input.lower = hVar1.upper;
    Hugeint::TryCast<long>((Hugeint *)hVar1.lower,input,(int64_t *)result_00);
    target->bits = (local_28 + (ulong)(state->count >> 1 < local_30)) * 0x1000000 | 0xe0ff;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			uint64_t remainder;
			auto micros = Hugeint::Cast<int64_t>(Hugeint::DivModPositive(state.value, state.count, remainder));
			// Round the result
			micros += (remainder > (state.count / 2));
			target = dtime_tz_t(dtime_t(micros), 0);
		}
	}